

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O2

bool __thiscall Debugger::SourceRunDown(Debugger *this)

{
  bool bVar1;
  JsErrorCode jsErrorCode;
  PAL_FILE *pPVar2;
  LPCWSTR pWVar3;
  undefined1 local_30 [8];
  AutoRestoreContext autoRestoreContext;
  JsValueRef sourcesList;
  
  AutoRestoreContext::AutoRestoreContext((AutoRestoreContext *)local_30,this->m_context);
  autoRestoreContext.contextChanged = false;
  autoRestoreContext._9_7_ = 0;
  jsErrorCode = (*ChakraRTInterface::m_jsApiHooks.pfJsrtDiagGetScripts)
                          ((JsValueRef *)&autoRestoreContext.contextChanged);
  if (jsErrorCode == JsNoError) {
    bVar1 = CallFunctionNoResult
                      (this,"HandleSourceRunDown",(JsValueRef)autoRestoreContext._8_8_,
                       (JsValueRef)0x0);
  }
  else {
    pPVar2 = PAL_get_stderr(0);
    pWVar3 = Helpers::JsErrorCodeToString(jsErrorCode);
    PAL_fwprintf(pPVar2,
                 L"ERROR: ChakraRTInterface::JsDiagGetScripts(&sourcesList) failed. JsErrorCode=0x%x (%s)\n"
                 ,(ulong)jsErrorCode,pWVar3);
    pPVar2 = PAL_get_stderr(0);
    PAL_fflush(pPVar2);
    bVar1 = false;
  }
  AutoRestoreContext::~AutoRestoreContext((AutoRestoreContext *)local_30);
  return bVar1;
}

Assistant:

bool Debugger::SourceRunDown()
{
    AutoRestoreContext autoRestoreContext(this->m_context);

    JsValueRef sourcesList = JS_INVALID_REFERENCE;
    IfJsrtErrorFailLogAndRetFalse(ChakraRTInterface::JsDiagGetScripts(&sourcesList));

    return this->CallFunctionNoResult("HandleSourceRunDown", sourcesList);
}